

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<sisl::cartesian_cubic<float>*const&>::
captureExpression<(Catch::Internal::Operator)1,long>
          (ExpressionLhs<sisl::cartesian_cubic<float>*const&> *this,long *rhs)

{
  undefined4 uVar1;
  cartesian_cubic<float> **in_RDX;
  allocator local_79;
  string local_78 [32];
  string local_58;
  string local_38;
  
  uVar1 = 0x11;
  if (*(long *)*(Catch **)(this + 0x228) != *rhs) {
    uVar1 = 0;
  }
  *(undefined4 *)(this + 0x40) = uVar1;
  toString<sisl::cartesian_cubic<float>*>(&local_38,*(Catch **)(this + 0x228),in_RDX);
  std::__cxx11::string::_M_assign((string *)(this + 0x50));
  Detail::StringMakerBase<true>::convert<long>(&local_58,rhs);
  std::__cxx11::string::_M_assign((string *)(this + 0x70));
  std::__cxx11::string::string(local_78,"!=",&local_79);
  std::__cxx11::string::_M_assign((string *)(this + 0x90));
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return (ExpressionResultBuilder *)this;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }